

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderRenderCase.cpp
# Opt level: O0

void deqp::gls::setupDefaultUniforms(RenderContext *context,deUint32 programID)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  int *piVar5;
  float *pfVar6;
  long lVar7;
  int local_98;
  int uniLoc_9;
  int i_9;
  int uniLoc_8;
  int i_8;
  int uniLoc_7;
  int i_7;
  int uniLoc_6;
  int i_6;
  int uniLoc_5;
  int i_5;
  int uniLoc_4;
  int i_4;
  int uniLoc_3;
  int i_3;
  int uniLoc_2;
  int i_2;
  int uniLoc_1;
  int arr [4];
  BVec4Uniform *uni;
  int i_1;
  int local_24;
  int uniLoc;
  int i;
  Functions *gl;
  deUint32 programID_local;
  RenderContext *context_local;
  long lVar4;
  
  iVar3 = (*context->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar3);
  for (local_24 = 0; local_24 < 2; local_24 = local_24 + 1) {
    iVar3 = (**(code **)(lVar4 + 0xb48))
                      (programID,setupDefaultUniforms::s_boolUniforms[local_24].name);
    if (iVar3 != -1) {
      lVar7 = (long)local_24;
      (**(code **)(lVar4 + 0x14f0))
                (iVar3,setupDefaultUniforms::s_boolUniforms[lVar7].value & 1,lVar7 * 0x10,
                 CONCAT71((int7)((ulong)(setupDefaultUniforms::s_boolUniforms + lVar7) >> 8),
                          setupDefaultUniforms::s_boolUniforms[lVar7].value) & 0xffffffffffffff01);
    }
  }
  if (setupDefaultUniforms(glu::RenderContext_const&,unsigned_int)::s_bvec4Uniforms == '\0') {
    iVar3 = __cxa_guard_acquire(&setupDefaultUniforms(glu::RenderContext_const&,unsigned_int)::
                                 s_bvec4Uniforms);
    if (iVar3 != 0) {
      setupDefaultUniforms::s_bvec4Uniforms[0].name = "ub4_true";
      tcu::Vector<bool,_4>::Vector(&setupDefaultUniforms::s_bvec4Uniforms[0].value,true);
      setupDefaultUniforms::s_bvec4Uniforms[1].name = "ub4_false";
      tcu::Vector<bool,_4>::Vector(&setupDefaultUniforms::s_bvec4Uniforms[1].value,false);
      __cxa_guard_release(&setupDefaultUniforms(glu::RenderContext_const&,unsigned_int)::
                           s_bvec4Uniforms);
    }
  }
  for (uni._0_4_ = 0; (int)uni < 2; uni._0_4_ = (int)uni + 1) {
    lVar7 = (long)(int)uni;
    bVar2 = tcu::Vector<bool,_4>::x(&setupDefaultUniforms::s_bvec4Uniforms[lVar7].value);
    i_2 = (int)bVar2;
    bVar2 = tcu::Vector<bool,_4>::y(&setupDefaultUniforms::s_bvec4Uniforms[lVar7].value);
    uniLoc_1 = (int)bVar2;
    bVar2 = tcu::Vector<bool,_4>::z(&setupDefaultUniforms::s_bvec4Uniforms[lVar7].value);
    arr[0] = (int)bVar2;
    bVar2 = tcu::Vector<bool,_4>::w(&setupDefaultUniforms::s_bvec4Uniforms[lVar7].value);
    arr[1] = (int)bVar2;
    iVar3 = (**(code **)(lVar4 + 0xb48))
                      (programID,setupDefaultUniforms::s_bvec4Uniforms[lVar7].name);
    if (iVar3 != -1) {
      (**(code **)(lVar4 + 0x15b8))(iVar3,1,&i_2);
    }
  }
  for (i_3 = 0; i_3 < 0xb; i_3 = i_3 + 1) {
    iVar3 = (**(code **)(lVar4 + 0xb48))(programID,setupDefaultUniforms::s_intUniforms[i_3].name);
    if (iVar3 != -1) {
      (**(code **)(lVar4 + 0x14f0))(iVar3,setupDefaultUniforms::s_intUniforms[i_3].value);
    }
  }
  if (setupDefaultUniforms(glu::RenderContext_const&,unsigned_int)::s_ivec2Uniforms == '\0') {
    iVar3 = __cxa_guard_acquire(&setupDefaultUniforms(glu::RenderContext_const&,unsigned_int)::
                                 s_ivec2Uniforms);
    if (iVar3 != 0) {
      setupDefaultUniforms::s_ivec2Uniforms[0].name = "ui2_minusOne";
      tcu::Vector<int,_2>::Vector(&setupDefaultUniforms::s_ivec2Uniforms[0].value,-1);
      setupDefaultUniforms::s_ivec2Uniforms[1].name = "ui2_zero";
      tcu::Vector<int,_2>::Vector(&setupDefaultUniforms::s_ivec2Uniforms[1].value,0);
      setupDefaultUniforms::s_ivec2Uniforms[2].name = "ui2_one";
      tcu::Vector<int,_2>::Vector(&setupDefaultUniforms::s_ivec2Uniforms[2].value,1);
      setupDefaultUniforms::s_ivec2Uniforms[3].name = "ui2_two";
      tcu::Vector<int,_2>::Vector(&setupDefaultUniforms::s_ivec2Uniforms[3].value,2);
      setupDefaultUniforms::s_ivec2Uniforms[4].name = "ui2_four";
      tcu::Vector<int,_2>::Vector(&setupDefaultUniforms::s_ivec2Uniforms[4].value,4);
      setupDefaultUniforms::s_ivec2Uniforms[5].name = "ui2_five";
      tcu::Vector<int,_2>::Vector(&setupDefaultUniforms::s_ivec2Uniforms[5].value,5);
      __cxa_guard_release(&setupDefaultUniforms(glu::RenderContext_const&,unsigned_int)::
                           s_ivec2Uniforms);
    }
  }
  for (i_4 = 0; i_4 < 6; i_4 = i_4 + 1) {
    iVar3 = (**(code **)(lVar4 + 0xb48))(programID,setupDefaultUniforms::s_ivec2Uniforms[i_4].name);
    if (iVar3 != -1) {
      pcVar1 = *(code **)(lVar4 + 0x1538);
      piVar5 = tcu::Vector<int,_2>::getPtr(&setupDefaultUniforms::s_ivec2Uniforms[i_4].value);
      (*pcVar1)(iVar3,1,piVar5);
    }
  }
  if (setupDefaultUniforms(glu::RenderContext_const&,unsigned_int)::s_ivec3Uniforms == '\0') {
    iVar3 = __cxa_guard_acquire(&setupDefaultUniforms(glu::RenderContext_const&,unsigned_int)::
                                 s_ivec3Uniforms);
    if (iVar3 != 0) {
      setupDefaultUniforms::s_ivec3Uniforms[0].name = "ui3_minusOne";
      tcu::Vector<int,_3>::Vector(&setupDefaultUniforms::s_ivec3Uniforms[0].value,-1);
      setupDefaultUniforms::s_ivec3Uniforms[1].name = "ui3_zero";
      tcu::Vector<int,_3>::Vector(&setupDefaultUniforms::s_ivec3Uniforms[1].value,0);
      setupDefaultUniforms::s_ivec3Uniforms[2].name = "ui3_one";
      tcu::Vector<int,_3>::Vector(&setupDefaultUniforms::s_ivec3Uniforms[2].value,1);
      setupDefaultUniforms::s_ivec3Uniforms[3].name = "ui3_two";
      tcu::Vector<int,_3>::Vector(&setupDefaultUniforms::s_ivec3Uniforms[3].value,2);
      setupDefaultUniforms::s_ivec3Uniforms[4].name = "ui3_four";
      tcu::Vector<int,_3>::Vector(&setupDefaultUniforms::s_ivec3Uniforms[4].value,4);
      setupDefaultUniforms::s_ivec3Uniforms[5].name = "ui3_five";
      tcu::Vector<int,_3>::Vector(&setupDefaultUniforms::s_ivec3Uniforms[5].value,5);
      __cxa_guard_release(&setupDefaultUniforms(glu::RenderContext_const&,unsigned_int)::
                           s_ivec3Uniforms);
    }
  }
  for (i_5 = 0; i_5 < 6; i_5 = i_5 + 1) {
    iVar3 = (**(code **)(lVar4 + 0xb48))(programID,setupDefaultUniforms::s_ivec3Uniforms[i_5].name);
    if (iVar3 != -1) {
      pcVar1 = *(code **)(lVar4 + 0x1578);
      piVar5 = tcu::Vector<int,_3>::getPtr(&setupDefaultUniforms::s_ivec3Uniforms[i_5].value);
      (*pcVar1)(iVar3,1,piVar5);
    }
  }
  if (setupDefaultUniforms(glu::RenderContext_const&,unsigned_int)::s_ivec4Uniforms == '\0') {
    iVar3 = __cxa_guard_acquire(&setupDefaultUniforms(glu::RenderContext_const&,unsigned_int)::
                                 s_ivec4Uniforms);
    if (iVar3 != 0) {
      setupDefaultUniforms::s_ivec4Uniforms[0].name = "ui4_minusOne";
      tcu::Vector<int,_4>::Vector(&setupDefaultUniforms::s_ivec4Uniforms[0].value,-1);
      setupDefaultUniforms::s_ivec4Uniforms[1].name = "ui4_zero";
      tcu::Vector<int,_4>::Vector(&setupDefaultUniforms::s_ivec4Uniforms[1].value,0);
      setupDefaultUniforms::s_ivec4Uniforms[2].name = "ui4_one";
      tcu::Vector<int,_4>::Vector(&setupDefaultUniforms::s_ivec4Uniforms[2].value,1);
      setupDefaultUniforms::s_ivec4Uniforms[3].name = "ui4_two";
      tcu::Vector<int,_4>::Vector(&setupDefaultUniforms::s_ivec4Uniforms[3].value,2);
      setupDefaultUniforms::s_ivec4Uniforms[4].name = "ui4_four";
      tcu::Vector<int,_4>::Vector(&setupDefaultUniforms::s_ivec4Uniforms[4].value,4);
      setupDefaultUniforms::s_ivec4Uniforms[5].name = "ui4_five";
      tcu::Vector<int,_4>::Vector(&setupDefaultUniforms::s_ivec4Uniforms[5].value,5);
      __cxa_guard_release(&setupDefaultUniforms(glu::RenderContext_const&,unsigned_int)::
                           s_ivec4Uniforms);
    }
  }
  for (i_6 = 0; i_6 < 6; i_6 = i_6 + 1) {
    iVar3 = (**(code **)(lVar4 + 0xb48))(programID,setupDefaultUniforms::s_ivec4Uniforms[i_6].name);
    if (iVar3 != -1) {
      pcVar1 = *(code **)(lVar4 + 0x15b8);
      piVar5 = tcu::Vector<int,_4>::getPtr(&setupDefaultUniforms::s_ivec4Uniforms[i_6].value);
      (*pcVar1)(iVar3,1,piVar5);
    }
  }
  for (i_7 = 0; i_7 < 0x10; i_7 = i_7 + 1) {
    iVar3 = (**(code **)(lVar4 + 0xb48))(programID,setupDefaultUniforms::s_floatUniforms[i_7].name);
    if (iVar3 != -1) {
      (**(code **)(lVar4 + 0x14e0))(setupDefaultUniforms::s_floatUniforms[i_7].value,iVar3);
    }
  }
  if (setupDefaultUniforms(glu::RenderContext_const&,unsigned_int)::s_vec2Uniforms == '\0') {
    iVar3 = __cxa_guard_acquire(&setupDefaultUniforms(glu::RenderContext_const&,unsigned_int)::
                                 s_vec2Uniforms);
    if (iVar3 != 0) {
      setupDefaultUniforms::s_vec2Uniforms[0].name = "uv2_minusOne";
      tcu::Vector<float,_2>::Vector(&setupDefaultUniforms::s_vec2Uniforms[0].value,-1.0);
      setupDefaultUniforms::s_vec2Uniforms[1].name = "uv2_zero";
      tcu::Vector<float,_2>::Vector(&setupDefaultUniforms::s_vec2Uniforms[1].value,0.0);
      setupDefaultUniforms::s_vec2Uniforms[2].name = "uv2_half";
      tcu::Vector<float,_2>::Vector(&setupDefaultUniforms::s_vec2Uniforms[2].value,0.5);
      setupDefaultUniforms::s_vec2Uniforms[3].name = "uv2_one";
      tcu::Vector<float,_2>::Vector(&setupDefaultUniforms::s_vec2Uniforms[3].value,1.0);
      setupDefaultUniforms::s_vec2Uniforms[4].name = "uv2_two";
      tcu::Vector<float,_2>::Vector(&setupDefaultUniforms::s_vec2Uniforms[4].value,2.0);
      __cxa_guard_release(&setupDefaultUniforms(glu::RenderContext_const&,unsigned_int)::
                           s_vec2Uniforms);
    }
  }
  for (i_8 = 0; i_8 < 5; i_8 = i_8 + 1) {
    iVar3 = (**(code **)(lVar4 + 0xb48))(programID,setupDefaultUniforms::s_vec2Uniforms[i_8].name);
    if (iVar3 != -1) {
      pcVar1 = *(code **)(lVar4 + 0x1528);
      pfVar6 = tcu::Vector<float,_2>::getPtr(&setupDefaultUniforms::s_vec2Uniforms[i_8].value);
      (*pcVar1)(iVar3,1,pfVar6);
    }
  }
  if (setupDefaultUniforms(glu::RenderContext_const&,unsigned_int)::s_vec3Uniforms == '\0') {
    iVar3 = __cxa_guard_acquire(&setupDefaultUniforms(glu::RenderContext_const&,unsigned_int)::
                                 s_vec3Uniforms);
    if (iVar3 != 0) {
      setupDefaultUniforms::s_vec3Uniforms[0].name = "uv3_minusOne";
      tcu::Vector<float,_3>::Vector(&setupDefaultUniforms::s_vec3Uniforms[0].value,-1.0);
      setupDefaultUniforms::s_vec3Uniforms[1].name = "uv3_zero";
      tcu::Vector<float,_3>::Vector(&setupDefaultUniforms::s_vec3Uniforms[1].value,0.0);
      setupDefaultUniforms::s_vec3Uniforms[2].name = "uv3_half";
      tcu::Vector<float,_3>::Vector(&setupDefaultUniforms::s_vec3Uniforms[2].value,0.5);
      setupDefaultUniforms::s_vec3Uniforms[3].name = "uv3_one";
      tcu::Vector<float,_3>::Vector(&setupDefaultUniforms::s_vec3Uniforms[3].value,1.0);
      setupDefaultUniforms::s_vec3Uniforms[4].name = "uv3_two";
      tcu::Vector<float,_3>::Vector(&setupDefaultUniforms::s_vec3Uniforms[4].value,2.0);
      __cxa_guard_release(&setupDefaultUniforms(glu::RenderContext_const&,unsigned_int)::
                           s_vec3Uniforms);
    }
  }
  for (i_9 = 0; i_9 < 5; i_9 = i_9 + 1) {
    iVar3 = (**(code **)(lVar4 + 0xb48))(programID,setupDefaultUniforms::s_vec3Uniforms[i_9].name);
    if (iVar3 != -1) {
      pcVar1 = *(code **)(lVar4 + 0x1568);
      pfVar6 = tcu::Vector<float,_3>::getPtr(&setupDefaultUniforms::s_vec3Uniforms[i_9].value);
      (*pcVar1)(iVar3,1,pfVar6);
    }
  }
  if (setupDefaultUniforms(glu::RenderContext_const&,unsigned_int)::s_vec4Uniforms == '\0') {
    iVar3 = __cxa_guard_acquire(&setupDefaultUniforms(glu::RenderContext_const&,unsigned_int)::
                                 s_vec4Uniforms);
    if (iVar3 != 0) {
      setupDefaultUniforms::s_vec4Uniforms[0].name = "uv4_minusOne";
      tcu::Vector<float,_4>::Vector(&setupDefaultUniforms::s_vec4Uniforms[0].value,-1.0);
      setupDefaultUniforms::s_vec4Uniforms[1].name = "uv4_zero";
      tcu::Vector<float,_4>::Vector(&setupDefaultUniforms::s_vec4Uniforms[1].value,0.0);
      setupDefaultUniforms::s_vec4Uniforms[2].name = "uv4_half";
      tcu::Vector<float,_4>::Vector(&setupDefaultUniforms::s_vec4Uniforms[2].value,0.5);
      setupDefaultUniforms::s_vec4Uniforms[3].name = "uv4_one";
      tcu::Vector<float,_4>::Vector(&setupDefaultUniforms::s_vec4Uniforms[3].value,1.0);
      setupDefaultUniforms::s_vec4Uniforms[4].name = "uv4_two";
      tcu::Vector<float,_4>::Vector(&setupDefaultUniforms::s_vec4Uniforms[4].value,2.0);
      setupDefaultUniforms::s_vec4Uniforms[5].name = "uv4_black";
      tcu::Vector<float,_4>::Vector(&setupDefaultUniforms::s_vec4Uniforms[5].value,0.0,0.0,0.0,1.0);
      setupDefaultUniforms::s_vec4Uniforms[6].name = "uv4_gray";
      tcu::Vector<float,_4>::Vector(&setupDefaultUniforms::s_vec4Uniforms[6].value,0.5,0.5,0.5,1.0);
      setupDefaultUniforms::s_vec4Uniforms[7].name = "uv4_white";
      tcu::Vector<float,_4>::Vector(&setupDefaultUniforms::s_vec4Uniforms[7].value,1.0,1.0,1.0,1.0);
      __cxa_guard_release(&setupDefaultUniforms(glu::RenderContext_const&,unsigned_int)::
                           s_vec4Uniforms);
    }
  }
  for (local_98 = 0; local_98 < 8; local_98 = local_98 + 1) {
    iVar3 = (**(code **)(lVar4 + 0xb48))
                      (programID,setupDefaultUniforms::s_vec4Uniforms[local_98].name);
    if (iVar3 != -1) {
      pcVar1 = *(code **)(lVar4 + 0x15a8);
      pfVar6 = tcu::Vector<float,_4>::getPtr(&setupDefaultUniforms::s_vec4Uniforms[local_98].value);
      (*pcVar1)(iVar3,1,pfVar6);
    }
  }
  return;
}

Assistant:

void setupDefaultUniforms (const glu::RenderContext& context, deUint32 programID)
{
	const glw::Functions& gl = context.getFunctions();

	// Bool.
	struct BoolUniform { const char* name; bool value; };
	static const BoolUniform s_boolUniforms[] =
	{
		{ "ub_true",	true },
		{ "ub_false",	false },
	};

	for (int i = 0; i < DE_LENGTH_OF_ARRAY(s_boolUniforms); i++)
	{
		int uniLoc = gl.getUniformLocation(programID, s_boolUniforms[i].name);
		if (uniLoc != -1)
			gl.uniform1i(uniLoc, s_boolUniforms[i].value);
	}

	// BVec4.
	struct BVec4Uniform { const char* name; BVec4 value; };
	static const BVec4Uniform s_bvec4Uniforms[] =
	{
		{ "ub4_true",	BVec4(true) },
		{ "ub4_false",	BVec4(false) },
	};

	for (int i = 0; i < DE_LENGTH_OF_ARRAY(s_bvec4Uniforms); i++)
	{
		const BVec4Uniform& uni = s_bvec4Uniforms[i];
		int arr[4];
		arr[0] = (int)uni.value.x();
		arr[1] = (int)uni.value.y();
		arr[2] = (int)uni.value.z();
		arr[3] = (int)uni.value.w();
		int uniLoc = gl.getUniformLocation(programID, uni.name);
		if (uniLoc != -1)
			gl.uniform4iv(uniLoc, 1, &arr[0]);
	}

	// Int.
	struct IntUniform { const char* name; int value; };
	static const IntUniform s_intUniforms[] =
	{
		{ "ui_minusOne",		-1 },
		{ "ui_zero",			0 },
		{ "ui_one",				1 },
		{ "ui_two",				2 },
		{ "ui_three",			3 },
		{ "ui_four",			4 },
		{ "ui_five",			5 },
		{ "ui_six",				6 },
		{ "ui_seven",			7 },
		{ "ui_eight",			8 },
		{ "ui_oneHundredOne",	101 }
	};

	for (int i = 0; i < DE_LENGTH_OF_ARRAY(s_intUniforms); i++)
	{
		int uniLoc = gl.getUniformLocation(programID, s_intUniforms[i].name);
		if (uniLoc != -1)
			gl.uniform1i(uniLoc, s_intUniforms[i].value);
	}

	// IVec2.
	struct IVec2Uniform { const char* name; IVec2 value; };
	static const IVec2Uniform s_ivec2Uniforms[] =
	{
		{ "ui2_minusOne",	IVec2(-1) },
		{ "ui2_zero",		IVec2(0) },
		{ "ui2_one",		IVec2(1) },
		{ "ui2_two",		IVec2(2) },
		{ "ui2_four",		IVec2(4) },
		{ "ui2_five",		IVec2(5) }
	};

	for (int i = 0; i < DE_LENGTH_OF_ARRAY(s_ivec2Uniforms); i++)
	{
		int uniLoc = gl.getUniformLocation(programID, s_ivec2Uniforms[i].name);
		if (uniLoc != -1)
			gl.uniform2iv(uniLoc, 1, s_ivec2Uniforms[i].value.getPtr());
	}

	// IVec3.
	struct IVec3Uniform { const char* name; IVec3 value; };
	static const IVec3Uniform s_ivec3Uniforms[] =
	{
		{ "ui3_minusOne",	IVec3(-1) },
		{ "ui3_zero",		IVec3(0) },
		{ "ui3_one",		IVec3(1) },
		{ "ui3_two",		IVec3(2) },
		{ "ui3_four",		IVec3(4) },
		{ "ui3_five",		IVec3(5) }
	};

	for (int i = 0; i < DE_LENGTH_OF_ARRAY(s_ivec3Uniforms); i++)
	{
		int uniLoc = gl.getUniformLocation(programID, s_ivec3Uniforms[i].name);
		if (uniLoc != -1)
			gl.uniform3iv(uniLoc, 1, s_ivec3Uniforms[i].value.getPtr());
	}

	// IVec4.
	struct IVec4Uniform { const char* name; IVec4 value; };
	static const IVec4Uniform s_ivec4Uniforms[] =
	{
		{ "ui4_minusOne",	IVec4(-1) },
		{ "ui4_zero",		IVec4(0) },
		{ "ui4_one",		IVec4(1) },
		{ "ui4_two",		IVec4(2) },
		{ "ui4_four",		IVec4(4) },
		{ "ui4_five",		IVec4(5) }
	};

	for (int i = 0; i < DE_LENGTH_OF_ARRAY(s_ivec4Uniforms); i++)
	{
		int uniLoc = gl.getUniformLocation(programID, s_ivec4Uniforms[i].name);
		if (uniLoc != -1)
			gl.uniform4iv(uniLoc, 1, s_ivec4Uniforms[i].value.getPtr());
	}

	// Float.
	struct FloatUniform { const char* name; float value; };
	static const FloatUniform s_floatUniforms[] =
	{
		{ "uf_zero",	0.0f },
		{ "uf_one",		1.0f },
		{ "uf_two",		2.0f },
		{ "uf_three",	3.0f },
		{ "uf_four",	4.0f },
		{ "uf_five",	5.0f },
		{ "uf_six",		6.0f },
		{ "uf_seven",	7.0f },
		{ "uf_eight",	8.0f },
		{ "uf_half",	1.0f / 2.0f },
		{ "uf_third",	1.0f / 3.0f },
		{ "uf_fourth",	1.0f / 4.0f },
		{ "uf_fifth",	1.0f / 5.0f },
		{ "uf_sixth",	1.0f / 6.0f },
		{ "uf_seventh",	1.0f / 7.0f },
		{ "uf_eighth",	1.0f / 8.0f }
	};

	for (int i = 0; i < DE_LENGTH_OF_ARRAY(s_floatUniforms); i++)
	{
		int uniLoc = gl.getUniformLocation(programID, s_floatUniforms[i].name);
		if (uniLoc != -1)
			gl.uniform1f(uniLoc, s_floatUniforms[i].value);
	}

	// Vec2.
	struct Vec2Uniform { const char* name; Vec2 value; };
	static const Vec2Uniform s_vec2Uniforms[] =
	{
		{ "uv2_minusOne",	Vec2(-1.0f) },
		{ "uv2_zero",		Vec2(0.0f) },
		{ "uv2_half",		Vec2(0.5f) },
		{ "uv2_one",		Vec2(1.0f) },
		{ "uv2_two",		Vec2(2.0f) },
	};

	for (int i = 0; i < DE_LENGTH_OF_ARRAY(s_vec2Uniforms); i++)
	{
		int uniLoc = gl.getUniformLocation(programID, s_vec2Uniforms[i].name);
		if (uniLoc != -1)
			gl.uniform2fv(uniLoc, 1, s_vec2Uniforms[i].value.getPtr());
	}

	// Vec3.
	struct Vec3Uniform { const char* name; Vec3 value; };
	static const Vec3Uniform s_vec3Uniforms[] =
	{
		{ "uv3_minusOne",	Vec3(-1.0f) },
		{ "uv3_zero",		Vec3(0.0f) },
		{ "uv3_half",		Vec3(0.5f) },
		{ "uv3_one",		Vec3(1.0f) },
		{ "uv3_two",		Vec3(2.0f) },
	};

	for (int i = 0; i < DE_LENGTH_OF_ARRAY(s_vec3Uniforms); i++)
	{
		int uniLoc = gl.getUniformLocation(programID, s_vec3Uniforms[i].name);
		if (uniLoc != -1)
			gl.uniform3fv(uniLoc, 1, s_vec3Uniforms[i].value.getPtr());
	}

	// Vec4.
	struct Vec4Uniform { const char* name; Vec4 value; };
	static const Vec4Uniform s_vec4Uniforms[] =
	{
		{ "uv4_minusOne",	Vec4(-1.0f) },
		{ "uv4_zero",		Vec4(0.0f) },
		{ "uv4_half",		Vec4(0.5f) },
		{ "uv4_one",		Vec4(1.0f) },
		{ "uv4_two",		Vec4(2.0f) },
		{ "uv4_black",		Vec4(0.0f, 0.0f, 0.0f, 1.0f) },
		{ "uv4_gray",		Vec4(0.5f, 0.5f, 0.5f, 1.0f) },
		{ "uv4_white",		Vec4(1.0f, 1.0f, 1.0f, 1.0f) },
	};

	for (int i = 0; i < DE_LENGTH_OF_ARRAY(s_vec4Uniforms); i++)
	{
		int uniLoc = gl.getUniformLocation(programID, s_vec4Uniforms[i].name);
		if (uniLoc != -1)
			gl.uniform4fv(uniLoc, 1, s_vec4Uniforms[i].value.getPtr());
	}
}